

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

void __thiscall absl::lts_20240722::AlphaNum::AlphaNum(AlphaNum *this,long x)

{
  long lVar1;
  long x_local;
  AlphaNum *this_local;
  
  lVar1 = absl::lts_20240722::numbers_internal::FastIntToBuffer(x,this->digits_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&this->piece_,this->digits_,lVar1 - (long)this->digits_);
  return;
}

Assistant:

AlphaNum(long x)  // NOLINT(*)
      : piece_(digits_, static_cast<size_t>(
                            numbers_internal::FastIntToBuffer(x, digits_) -
                            &digits_[0])) {}